

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base.cpp
# Opt level: O0

void __thiscall xmrig::Base::Base(Base *this,Process *process)

{
  Api *pAVar1;
  Process *in_RDI;
  BasePrivate *this_00;
  
  IWatcherListener::IWatcherListener((IWatcherListener *)in_RDI);
  IApiListener::IApiListener((IApiListener *)&(in_RDI->m_arguments).m_argc);
  (in_RDI->m_arguments).m_argv = &PTR__Base_002b6888;
  *(undefined ***)&(in_RDI->m_arguments).m_argc = &PTR__Base_002b68d8;
  this_00 = (BasePrivate *)&(in_RDI->m_arguments).m_data;
  pAVar1 = (Api *)operator_new(0x30);
  BasePrivate::BasePrivate(this_00,in_RDI);
  this_00->api = pAVar1;
  return;
}

Assistant:

xmrig::Base::Base(Process *process)
    : d_ptr(new BasePrivate(process))
{
}